

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_parseResetIllegalChild_Test::TestBody(Parser_parseResetIllegalChild_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2f8 [8];
  Message local_2f0 [8];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_7;
  undefined1 local_2d0 [8];
  string rt;
  string resetValueString;
  Message local_288 [8];
  undefined1 local_280 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_268 [8];
  string t;
  string testValueString;
  Message local_220 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_5;
  VariablePtr v2;
  Message local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_4;
  VariablePtr v1;
  Message local_180 [8];
  int local_178 [2];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  ResetPtr r;
  Message local_148 [8];
  unsigned_long local_140 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  ComponentPtr c;
  Message local_108 [8];
  shared_ptr<libcellml::Issue> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8 [8];
  unsigned_long local_b0 [2];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  ModelPtr model;
  ParserPtr p;
  string local_68 [8];
  string in;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e;
  Parser_parseResetIllegalChild_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "Reset in component \'componentA\' has an invalid child \'initial_value\'.",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\" id=\"mid\">\n  <component name=\"componentA\" id=\"c2id\">\n    <variable name=\"variable1\" units=\"\" id=\"vid\"/>\n    <variable name=\"variable2\" units=\"\" id=\"vid2\"/>\n    <reset order=\"1\" id=\"rid\" variable=\"variable1\" test_variable=\"variable2\">\n      <test_value>\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply />\n        </math>\n      </test_value>\n      <reset_value>\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply />\n        </math>\n      </reset_value>\n      <initial_value>\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply />\n        </math>\n      </initial_value>\n    </reset>\n  </component>\n</model>\n"
             ,(allocator<char> *)
              ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)&gtest_ar.message_);
  local_b0[1] = 1;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_b0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_a0,"size_t(1)","p->errorCount()",local_b0 + 1,local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x7d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_100);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_100);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_d0,"e","p->error(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_f0
            );
  std::__cxx11::string::~string((string *)&local_f0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x7d3,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_108);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ComponentEntity::component((ulong)&gtest_ar_2.message_);
  local_140[1] = 1;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_2.message_);
  local_140[0] = libcellml::Component::resetCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_130,"size_t(1)","c->resetCount()",local_140 + 1,local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x7d6,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_148);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_2.message_);
  libcellml::Component::reset((ulong)&gtest_ar_3.message_);
  local_178[1] = 1;
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  local_178[0] = libcellml::Reset::order();
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_170,"1","r->order()",local_178 + 1,local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x7d9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_180);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::Reset::variable();
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_4.message_);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_1a8,"\"variable1\"","v1->name()",(char (*) [10])"variable1",
             &local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x7dc,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_1d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::Reset::testVariable();
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_5.message_);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_1f8,"\"variable2\"","v2->name()",(char (*) [10])"variable2",
             &local_218);
  std::__cxx11::string::~string((string *)&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(testValueString.field_2._M_local_buf + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x7df,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(testValueString.field_2._M_local_buf + 8),local_220);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(testValueString.field_2._M_local_buf + 8));
    testing::Message::~Message(local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::Reset::testValue_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply/>\n        </math>\n"
             ,(allocator<char> *)((long)&gtest_ar_6.message_.ptr_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_6.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_280,"t","testValueString",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&t.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(resetValueString.field_2._M_local_buf + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x7e6,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(resetValueString.field_2._M_local_buf + 8),local_288);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(resetValueString.field_2._M_local_buf + 8));
    testing::Message::~Message(local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::Reset::resetValue_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply/>\n        </math>\n"
             ,(allocator<char> *)((long)&gtest_ar_7.message_.ptr_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_7.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_2e8,"rt","resetValueString",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rt.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x7ed,pcVar2);
    testing::internal::AssertHelper::operator=(local_2f8,local_2f0);
    testing::internal::AssertHelper::~AssertHelper(local_2f8);
    testing::Message::~Message(local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)(rt.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)(t.field_2._M_local_buf + 8));
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)&gtest_ar_5.message_);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)&gtest_ar_4.message_);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)&gtest_ar_3.message_);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Parser, parseResetIllegalChild)
{
    const std::string e = "Reset in component 'componentA' has an invalid child 'initial_value'.";
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\" id=\"mid\">\n"
        "  <component name=\"componentA\" id=\"c2id\">\n"
        "    <variable name=\"variable1\" units=\"\" id=\"vid\"/>\n"
        "    <variable name=\"variable2\" units=\"\" id=\"vid2\"/>\n"
        "    <reset order=\"1\" id=\"rid\" variable=\"variable1\" test_variable=\"variable2\">\n"
        "      <test_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </test_value>\n"
        "      <reset_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </reset_value>\n"
        "      <initial_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </initial_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(in);

    EXPECT_EQ(size_t(1), p->errorCount());
    EXPECT_EQ(e, p->error(0)->description());

    libcellml::ComponentPtr c = model->component(0);
    EXPECT_EQ(size_t(1), c->resetCount());

    libcellml::ResetPtr r = c->reset(0);
    EXPECT_EQ(1, r->order());

    libcellml::VariablePtr v1 = r->variable();
    EXPECT_EQ("variable1", v1->name());

    libcellml::VariablePtr v2 = r->testVariable();
    EXPECT_EQ("variable2", v2->name());

    std::string testValueString = r->testValue();
    const std::string t =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply/>\n"
        "        </math>\n";
    EXPECT_EQ(t, testValueString);

    std::string resetValueString = r->resetValue();
    const std::string rt =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply/>\n"
        "        </math>\n";
    EXPECT_EQ(rt, resetValueString);
}